

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::UniformCase::writeUniformCompareExpr
          (UniformCase *this,ostringstream *dst,BasicUniform *uniform)

{
  DataType DVar1;
  char *pcVar2;
  size_t sVar3;
  ostream *poVar4;
  size_type sVar5;
  VarValue *value;
  int iVar6;
  uint uVar7;
  string local_40;
  
  DVar1 = uniform->type;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)dst,"compare_",8);
  if (DVar1 - TYPE_SAMPLER_1D < 0x1e) {
    uVar7 = uniform->type - TYPE_SAMPLER_2D;
    DVar1 = TYPE_LAST;
    if (uVar7 < 0x19) {
      DVar1 = *(DataType *)(&DAT_0097f538 + (ulong)uVar7 * 4);
    }
    pcVar2 = glu::getDataTypeName(DVar1);
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)dst + (int)*(undefined8 *)(*(long *)dst + -0x18));
    }
    else {
      sVar3 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)dst,pcVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)dst,"(texture(",9);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)dst,(uniform->name)._M_dataplus._M_p,
                        (uniform->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", vec",5);
    uVar7 = uniform->type - TYPE_SAMPLER_2D;
    iVar6 = 0;
    if (uVar7 < 0x19) {
      iVar6 = *(int *)(&DAT_0097f59c + (ulong)uVar7 * 4);
    }
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar6);
    pcVar2 = "(0.0))";
    sVar5 = 6;
  }
  else {
    pcVar2 = glu::getDataTypeName(uniform->type);
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)dst + (int)*(undefined8 *)(*(long *)dst + -0x18));
    }
    else {
      sVar3 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)dst,pcVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)dst,"(",1);
    pcVar2 = (uniform->name)._M_dataplus._M_p;
    sVar5 = (uniform->name)._M_string_length;
    poVar4 = (ostream *)dst;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar2,sVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)dst,", ",2);
  shaderVarValueStr_abi_cxx11_(&local_40,(Functional *)&uniform->finalValue,value);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)dst,local_40._M_dataplus._M_p,local_40._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void UniformCase::writeUniformCompareExpr (std::ostringstream& dst, const BasicUniform& uniform) const
{
	if (glu::isDataTypeSampler(uniform.type))
		dst << "compare_" << glu::getDataTypeName(getSamplerLookupReturnType(uniform.type)) << "(texture(" << uniform.name << ", vec" << getSamplerNumLookupDimensions(uniform.type) << "(0.0))";
	else
		dst << "compare_" << glu::getDataTypeName(uniform.type) << "(" << uniform.name;

	dst << ", " << shaderVarValueStr(uniform.finalValue) << ")";
}